

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

ssize_t __thiscall
QTextStreamPrivate::write(QTextStreamPrivate *this,int __fd,void *__buf,size_t __n)

{
  QString *pQVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  
  if (this->string != (QString *)0x0) {
    pQVar1 = QString::append(this->string,(QChar *)CONCAT44(in_register_00000034,__fd),
                             (qsizetype)__buf);
    return (ssize_t)pQVar1;
  }
  pQVar1 = QString::append(&this->writeBuffer,(QChar *)CONCAT44(in_register_00000034,__fd),
                           (qsizetype)__buf);
  if (0x4000 < (ulong)(this->writeBuffer).d.size) {
    flushWriteBuffer(this);
    return extraout_RAX;
  }
  return (ssize_t)pQVar1;
}

Assistant:

void QTextStreamPrivate::write(const QChar *data, qsizetype len)
{
    if (string) {
        // ### What about seek()??
        string->append(data, len);
    } else {
        writeBuffer.append(data, len);
        if (writeBuffer.size() > QTEXTSTREAM_BUFFERSIZE)
            flushWriteBuffer();
    }
}